

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

bool __thiscall
wasm::WasmBinaryBuilder::maybeVisitSIMDBinary
          (WasmBinaryBuilder *this,Expression **out,uint32_t code)

{
  bool bVar1;
  Binary *this_00;
  Expression *pEVar2;
  BinaryOp BVar3;
  
  bVar1 = false;
  switch(code) {
  case 0xe:
    BVar3 = SwizzleVecI8x16;
    break;
  default:
    goto switchD_009704f4_caseD_f;
  case 0x23:
    BVar3 = EqVecI8x16;
    break;
  case 0x24:
    BVar3 = NeVecI8x16;
    break;
  case 0x25:
    BVar3 = LtSVecI8x16;
    break;
  case 0x26:
    BVar3 = LtUVecI8x16;
    break;
  case 0x27:
    BVar3 = GtSVecI8x16;
    break;
  case 0x28:
    BVar3 = GtUVecI8x16;
    break;
  case 0x29:
    BVar3 = LeSVecI8x16;
    break;
  case 0x2a:
    BVar3 = LeUVecI8x16;
    break;
  case 0x2b:
    BVar3 = GeSVecI8x16;
    break;
  case 0x2c:
    BVar3 = GeUVecI8x16;
    break;
  case 0x2d:
    BVar3 = EqVecI16x8;
    break;
  case 0x2e:
    BVar3 = NeVecI16x8;
    break;
  case 0x2f:
    BVar3 = LtSVecI16x8;
    break;
  case 0x30:
    BVar3 = LtUVecI16x8;
    break;
  case 0x31:
    BVar3 = GtSVecI16x8;
    break;
  case 0x32:
    BVar3 = GtUVecI16x8;
    break;
  case 0x33:
    BVar3 = LeSVecI16x8;
    break;
  case 0x34:
    BVar3 = LeUVecI16x8;
    break;
  case 0x35:
    BVar3 = GeSVecI16x8;
    break;
  case 0x36:
    BVar3 = GeUVecI16x8;
    break;
  case 0x37:
    BVar3 = EqVecI32x4;
    break;
  case 0x38:
    BVar3 = NeVecI32x4;
    break;
  case 0x39:
    BVar3 = LtSVecI32x4;
    break;
  case 0x3a:
    BVar3 = LtUVecI32x4;
    break;
  case 0x3b:
    BVar3 = GtSVecI32x4;
    break;
  case 0x3c:
    BVar3 = GtUVecI32x4;
    break;
  case 0x3d:
    BVar3 = LeSVecI32x4;
    break;
  case 0x3e:
    BVar3 = LeUVecI32x4;
    break;
  case 0x3f:
    BVar3 = GeSVecI32x4;
    break;
  case 0x40:
    BVar3 = GeUVecI32x4;
    break;
  case 0x41:
    BVar3 = EqVecF32x4;
    break;
  case 0x42:
    BVar3 = NeVecF32x4;
    break;
  case 0x43:
    BVar3 = LtVecF32x4;
    break;
  case 0x44:
    BVar3 = GtVecF32x4;
    break;
  case 0x45:
    BVar3 = LeVecF32x4;
    break;
  case 0x46:
    BVar3 = GeVecF32x4;
    break;
  case 0x47:
    BVar3 = EqVecF64x2;
    break;
  case 0x48:
    BVar3 = NeVecF64x2;
    break;
  case 0x49:
    BVar3 = LtVecF64x2;
    break;
  case 0x4a:
    BVar3 = GtVecF64x2;
    break;
  case 0x4b:
    BVar3 = LeVecF64x2;
    break;
  case 0x4c:
    BVar3 = GeVecF64x2;
    break;
  case 0x4e:
    BVar3 = AndVec128;
    break;
  case 0x4f:
    BVar3 = AndNotVec128;
    break;
  case 0x50:
    BVar3 = OrVec128;
    break;
  case 0x51:
    BVar3 = XorVec128;
    break;
  case 0x65:
    BVar3 = NarrowSVecI16x8ToVecI8x16;
    break;
  case 0x66:
    BVar3 = NarrowUVecI16x8ToVecI8x16;
    break;
  case 0x6e:
    BVar3 = AddVecI8x16;
    break;
  case 0x6f:
    BVar3 = AddSatSVecI8x16;
    break;
  case 0x70:
    BVar3 = AddSatUVecI8x16;
    break;
  case 0x71:
    BVar3 = SubVecI8x16;
    break;
  case 0x72:
    BVar3 = SubSatSVecI8x16;
    break;
  case 0x73:
    BVar3 = SubSatUVecI8x16;
    break;
  case 0x76:
    BVar3 = MinSVecI8x16;
    break;
  case 0x77:
    BVar3 = MinUVecI8x16;
    break;
  case 0x78:
    BVar3 = MaxSVecI8x16;
    break;
  case 0x79:
    BVar3 = MaxUVecI8x16;
    break;
  case 0x7b:
    BVar3 = AvgrUVecI8x16;
    break;
  case 0x82:
    BVar3 = Q15MulrSatSVecI16x8;
    break;
  case 0x85:
    BVar3 = NarrowSVecI32x4ToVecI16x8;
    break;
  case 0x86:
    BVar3 = NarrowUVecI32x4ToVecI16x8;
    break;
  case 0x8e:
    BVar3 = AddVecI16x8;
    break;
  case 0x8f:
    BVar3 = AddSatSVecI16x8;
    break;
  case 0x90:
    BVar3 = AddSatUVecI16x8;
    break;
  case 0x91:
    BVar3 = SubVecI16x8;
    break;
  case 0x92:
    BVar3 = SubSatSVecI16x8;
    break;
  case 0x93:
    BVar3 = SubSatUVecI16x8;
    break;
  case 0x95:
    BVar3 = MulVecI16x8;
    break;
  case 0x96:
    BVar3 = MinSVecI16x8;
    break;
  case 0x97:
    BVar3 = MinUVecI16x8;
    break;
  case 0x98:
    BVar3 = MaxSVecI16x8;
    break;
  case 0x99:
    BVar3 = MaxUVecI16x8;
    break;
  case 0x9b:
    BVar3 = AvgrUVecI16x8;
    break;
  case 0x9c:
    BVar3 = ExtMulLowSVecI16x8;
    break;
  case 0x9d:
    BVar3 = ExtMulHighSVecI16x8;
    break;
  case 0x9e:
    BVar3 = ExtMulLowUVecI16x8;
    break;
  case 0x9f:
    BVar3 = ExtMulHighUVecI16x8;
    break;
  case 0xae:
    BVar3 = AddVecI32x4;
    break;
  case 0xb1:
    BVar3 = SubVecI32x4;
    break;
  case 0xb5:
    BVar3 = MulVecI32x4;
    break;
  case 0xb6:
    BVar3 = MinSVecI32x4;
    break;
  case 0xb7:
    BVar3 = MinUVecI32x4;
    break;
  case 0xb8:
    BVar3 = MaxSVecI32x4;
    break;
  case 0xb9:
    BVar3 = MaxUVecI32x4;
    break;
  case 0xba:
    BVar3 = DotSVecI16x8ToVecI32x4;
    break;
  case 0xbc:
    BVar3 = ExtMulLowSVecI32x4;
    break;
  case 0xbd:
    BVar3 = ExtMulHighSVecI32x4;
    break;
  case 0xbe:
    BVar3 = ExtMulLowUVecI32x4;
    break;
  case 0xbf:
    BVar3 = ExtMulHighUVecI32x4;
    break;
  case 0xce:
    BVar3 = AddVecI64x2;
    break;
  case 0xd1:
    BVar3 = SubVecI64x2;
    break;
  case 0xd5:
    BVar3 = MulVecI64x2;
    break;
  case 0xd6:
    BVar3 = EqVecI64x2;
    break;
  case 0xd7:
    BVar3 = NeVecI64x2;
    break;
  case 0xd8:
    BVar3 = LtSVecI64x2;
    break;
  case 0xd9:
    BVar3 = GtSVecI64x2;
    break;
  case 0xda:
    BVar3 = LeSVecI64x2;
    break;
  case 0xdb:
    BVar3 = GeSVecI64x2;
    break;
  case 0xdc:
    BVar3 = ExtMulLowSVecI64x2;
    break;
  case 0xdd:
    BVar3 = ExtMulHighSVecI64x2;
    break;
  case 0xde:
    BVar3 = ExtMulLowUVecI64x2;
    break;
  case 0xdf:
    BVar3 = ExtMulHighUVecI64x2;
    break;
  case 0xe4:
    BVar3 = AddVecF32x4;
    break;
  case 0xe5:
    BVar3 = SubVecF32x4;
    break;
  case 0xe6:
    BVar3 = MulVecF32x4;
    break;
  case 0xe7:
    BVar3 = DivVecF32x4;
    break;
  case 0xe8:
    BVar3 = MinVecF32x4;
    break;
  case 0xe9:
    BVar3 = MaxVecF32x4;
    break;
  case 0xea:
    BVar3 = PMinVecF32x4;
    break;
  case 0xeb:
    BVar3 = PMaxVecF32x4;
    break;
  case 0xf0:
    BVar3 = AddVecF64x2;
    break;
  case 0xf1:
    BVar3 = SubVecF64x2;
    break;
  case 0xf2:
    BVar3 = MulVecF64x2;
    break;
  case 0xf3:
    BVar3 = DivVecF64x2;
    break;
  case 0xf4:
    BVar3 = MinVecF64x2;
    break;
  case 0xf5:
    BVar3 = MaxVecF64x2;
    break;
  case 0xf6:
    BVar3 = PMinVecF64x2;
    break;
  case 0xf7:
    BVar3 = PMaxVecF64x2;
    break;
  case 0x100:
    BVar3 = RelaxedSwizzleVecI8x16;
    break;
  case 0x10d:
    BVar3 = RelaxedMinVecF32x4;
    break;
  case 0x10e:
    BVar3 = RelaxedMaxVecF32x4;
    break;
  case 0x10f:
    BVar3 = RelaxedMinVecF64x2;
    break;
  case 0x110:
    BVar3 = RelaxedMaxVecF64x2;
    break;
  case 0x111:
    BVar3 = RelaxedQ15MulrSVecI16x8;
    break;
  case 0x112:
    BVar3 = DotI8x16I7x16SToVecI16x8;
  }
  this_00 = (Binary *)MixedArena::allocSpace(this->allocator,0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_00->op = BVar3;
  bVar1 = isDebugEnabled("binary");
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"zz node: Binary\n",0x10);
  }
  pEVar2 = popNonVoidExpression(this);
  this_00->right = pEVar2;
  pEVar2 = popNonVoidExpression(this);
  this_00->left = pEVar2;
  Binary::finalize(this_00);
  *out = (Expression *)this_00;
  bVar1 = true;
switchD_009704f4_caseD_f:
  return bVar1;
}

Assistant:

bool WasmBinaryBuilder::maybeVisitSIMDBinary(Expression*& out, uint32_t code) {
  Binary* curr;
  switch (code) {
    case BinaryConsts::I8x16Eq:
      curr = allocator.alloc<Binary>();
      curr->op = EqVecI8x16;
      break;
    case BinaryConsts::I8x16Ne:
      curr = allocator.alloc<Binary>();
      curr->op = NeVecI8x16;
      break;
    case BinaryConsts::I8x16LtS:
      curr = allocator.alloc<Binary>();
      curr->op = LtSVecI8x16;
      break;
    case BinaryConsts::I8x16LtU:
      curr = allocator.alloc<Binary>();
      curr->op = LtUVecI8x16;
      break;
    case BinaryConsts::I8x16GtS:
      curr = allocator.alloc<Binary>();
      curr->op = GtSVecI8x16;
      break;
    case BinaryConsts::I8x16GtU:
      curr = allocator.alloc<Binary>();
      curr->op = GtUVecI8x16;
      break;
    case BinaryConsts::I8x16LeS:
      curr = allocator.alloc<Binary>();
      curr->op = LeSVecI8x16;
      break;
    case BinaryConsts::I8x16LeU:
      curr = allocator.alloc<Binary>();
      curr->op = LeUVecI8x16;
      break;
    case BinaryConsts::I8x16GeS:
      curr = allocator.alloc<Binary>();
      curr->op = GeSVecI8x16;
      break;
    case BinaryConsts::I8x16GeU:
      curr = allocator.alloc<Binary>();
      curr->op = GeUVecI8x16;
      break;
    case BinaryConsts::I16x8Eq:
      curr = allocator.alloc<Binary>();
      curr->op = EqVecI16x8;
      break;
    case BinaryConsts::I16x8Ne:
      curr = allocator.alloc<Binary>();
      curr->op = NeVecI16x8;
      break;
    case BinaryConsts::I16x8LtS:
      curr = allocator.alloc<Binary>();
      curr->op = LtSVecI16x8;
      break;
    case BinaryConsts::I16x8LtU:
      curr = allocator.alloc<Binary>();
      curr->op = LtUVecI16x8;
      break;
    case BinaryConsts::I16x8GtS:
      curr = allocator.alloc<Binary>();
      curr->op = GtSVecI16x8;
      break;
    case BinaryConsts::I16x8GtU:
      curr = allocator.alloc<Binary>();
      curr->op = GtUVecI16x8;
      break;
    case BinaryConsts::I16x8LeS:
      curr = allocator.alloc<Binary>();
      curr->op = LeSVecI16x8;
      break;
    case BinaryConsts::I16x8LeU:
      curr = allocator.alloc<Binary>();
      curr->op = LeUVecI16x8;
      break;
    case BinaryConsts::I16x8GeS:
      curr = allocator.alloc<Binary>();
      curr->op = GeSVecI16x8;
      break;
    case BinaryConsts::I16x8GeU:
      curr = allocator.alloc<Binary>();
      curr->op = GeUVecI16x8;
      break;
    case BinaryConsts::I32x4Eq:
      curr = allocator.alloc<Binary>();
      curr->op = EqVecI32x4;
      break;
    case BinaryConsts::I32x4Ne:
      curr = allocator.alloc<Binary>();
      curr->op = NeVecI32x4;
      break;
    case BinaryConsts::I32x4LtS:
      curr = allocator.alloc<Binary>();
      curr->op = LtSVecI32x4;
      break;
    case BinaryConsts::I32x4LtU:
      curr = allocator.alloc<Binary>();
      curr->op = LtUVecI32x4;
      break;
    case BinaryConsts::I32x4GtS:
      curr = allocator.alloc<Binary>();
      curr->op = GtSVecI32x4;
      break;
    case BinaryConsts::I32x4GtU:
      curr = allocator.alloc<Binary>();
      curr->op = GtUVecI32x4;
      break;
    case BinaryConsts::I32x4LeS:
      curr = allocator.alloc<Binary>();
      curr->op = LeSVecI32x4;
      break;
    case BinaryConsts::I32x4LeU:
      curr = allocator.alloc<Binary>();
      curr->op = LeUVecI32x4;
      break;
    case BinaryConsts::I32x4GeS:
      curr = allocator.alloc<Binary>();
      curr->op = GeSVecI32x4;
      break;
    case BinaryConsts::I32x4GeU:
      curr = allocator.alloc<Binary>();
      curr->op = GeUVecI32x4;
      break;
    case BinaryConsts::I64x2Eq:
      curr = allocator.alloc<Binary>();
      curr->op = EqVecI64x2;
      break;
    case BinaryConsts::I64x2Ne:
      curr = allocator.alloc<Binary>();
      curr->op = NeVecI64x2;
      break;
    case BinaryConsts::I64x2LtS:
      curr = allocator.alloc<Binary>();
      curr->op = LtSVecI64x2;
      break;
    case BinaryConsts::I64x2GtS:
      curr = allocator.alloc<Binary>();
      curr->op = GtSVecI64x2;
      break;
    case BinaryConsts::I64x2LeS:
      curr = allocator.alloc<Binary>();
      curr->op = LeSVecI64x2;
      break;
    case BinaryConsts::I64x2GeS:
      curr = allocator.alloc<Binary>();
      curr->op = GeSVecI64x2;
      break;
    case BinaryConsts::F32x4Eq:
      curr = allocator.alloc<Binary>();
      curr->op = EqVecF32x4;
      break;
    case BinaryConsts::F32x4Ne:
      curr = allocator.alloc<Binary>();
      curr->op = NeVecF32x4;
      break;
    case BinaryConsts::F32x4Lt:
      curr = allocator.alloc<Binary>();
      curr->op = LtVecF32x4;
      break;
    case BinaryConsts::F32x4Gt:
      curr = allocator.alloc<Binary>();
      curr->op = GtVecF32x4;
      break;
    case BinaryConsts::F32x4Le:
      curr = allocator.alloc<Binary>();
      curr->op = LeVecF32x4;
      break;
    case BinaryConsts::F32x4Ge:
      curr = allocator.alloc<Binary>();
      curr->op = GeVecF32x4;
      break;
    case BinaryConsts::F64x2Eq:
      curr = allocator.alloc<Binary>();
      curr->op = EqVecF64x2;
      break;
    case BinaryConsts::F64x2Ne:
      curr = allocator.alloc<Binary>();
      curr->op = NeVecF64x2;
      break;
    case BinaryConsts::F64x2Lt:
      curr = allocator.alloc<Binary>();
      curr->op = LtVecF64x2;
      break;
    case BinaryConsts::F64x2Gt:
      curr = allocator.alloc<Binary>();
      curr->op = GtVecF64x2;
      break;
    case BinaryConsts::F64x2Le:
      curr = allocator.alloc<Binary>();
      curr->op = LeVecF64x2;
      break;
    case BinaryConsts::F64x2Ge:
      curr = allocator.alloc<Binary>();
      curr->op = GeVecF64x2;
      break;
    case BinaryConsts::V128And:
      curr = allocator.alloc<Binary>();
      curr->op = AndVec128;
      break;
    case BinaryConsts::V128Or:
      curr = allocator.alloc<Binary>();
      curr->op = OrVec128;
      break;
    case BinaryConsts::V128Xor:
      curr = allocator.alloc<Binary>();
      curr->op = XorVec128;
      break;
    case BinaryConsts::V128Andnot:
      curr = allocator.alloc<Binary>();
      curr->op = AndNotVec128;
      break;
    case BinaryConsts::I8x16Add:
      curr = allocator.alloc<Binary>();
      curr->op = AddVecI8x16;
      break;
    case BinaryConsts::I8x16AddSatS:
      curr = allocator.alloc<Binary>();
      curr->op = AddSatSVecI8x16;
      break;
    case BinaryConsts::I8x16AddSatU:
      curr = allocator.alloc<Binary>();
      curr->op = AddSatUVecI8x16;
      break;
    case BinaryConsts::I8x16Sub:
      curr = allocator.alloc<Binary>();
      curr->op = SubVecI8x16;
      break;
    case BinaryConsts::I8x16SubSatS:
      curr = allocator.alloc<Binary>();
      curr->op = SubSatSVecI8x16;
      break;
    case BinaryConsts::I8x16SubSatU:
      curr = allocator.alloc<Binary>();
      curr->op = SubSatUVecI8x16;
      break;
    case BinaryConsts::I8x16MinS:
      curr = allocator.alloc<Binary>();
      curr->op = MinSVecI8x16;
      break;
    case BinaryConsts::I8x16MinU:
      curr = allocator.alloc<Binary>();
      curr->op = MinUVecI8x16;
      break;
    case BinaryConsts::I8x16MaxS:
      curr = allocator.alloc<Binary>();
      curr->op = MaxSVecI8x16;
      break;
    case BinaryConsts::I8x16MaxU:
      curr = allocator.alloc<Binary>();
      curr->op = MaxUVecI8x16;
      break;
    case BinaryConsts::I8x16AvgrU:
      curr = allocator.alloc<Binary>();
      curr->op = AvgrUVecI8x16;
      break;
    case BinaryConsts::I16x8Add:
      curr = allocator.alloc<Binary>();
      curr->op = AddVecI16x8;
      break;
    case BinaryConsts::I16x8AddSatS:
      curr = allocator.alloc<Binary>();
      curr->op = AddSatSVecI16x8;
      break;
    case BinaryConsts::I16x8AddSatU:
      curr = allocator.alloc<Binary>();
      curr->op = AddSatUVecI16x8;
      break;
    case BinaryConsts::I16x8Sub:
      curr = allocator.alloc<Binary>();
      curr->op = SubVecI16x8;
      break;
    case BinaryConsts::I16x8SubSatS:
      curr = allocator.alloc<Binary>();
      curr->op = SubSatSVecI16x8;
      break;
    case BinaryConsts::I16x8SubSatU:
      curr = allocator.alloc<Binary>();
      curr->op = SubSatUVecI16x8;
      break;
    case BinaryConsts::I16x8Mul:
      curr = allocator.alloc<Binary>();
      curr->op = MulVecI16x8;
      break;
    case BinaryConsts::I16x8MinS:
      curr = allocator.alloc<Binary>();
      curr->op = MinSVecI16x8;
      break;
    case BinaryConsts::I16x8MinU:
      curr = allocator.alloc<Binary>();
      curr->op = MinUVecI16x8;
      break;
    case BinaryConsts::I16x8MaxS:
      curr = allocator.alloc<Binary>();
      curr->op = MaxSVecI16x8;
      break;
    case BinaryConsts::I16x8MaxU:
      curr = allocator.alloc<Binary>();
      curr->op = MaxUVecI16x8;
      break;
    case BinaryConsts::I16x8AvgrU:
      curr = allocator.alloc<Binary>();
      curr->op = AvgrUVecI16x8;
      break;
    case BinaryConsts::I16x8Q15MulrSatS:
      curr = allocator.alloc<Binary>();
      curr->op = Q15MulrSatSVecI16x8;
      break;
    case BinaryConsts::I16x8ExtmulLowI8x16S:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulLowSVecI16x8;
      break;
    case BinaryConsts::I16x8ExtmulHighI8x16S:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulHighSVecI16x8;
      break;
    case BinaryConsts::I16x8ExtmulLowI8x16U:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulLowUVecI16x8;
      break;
    case BinaryConsts::I16x8ExtmulHighI8x16U:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulHighUVecI16x8;
      break;
    case BinaryConsts::I32x4Add:
      curr = allocator.alloc<Binary>();
      curr->op = AddVecI32x4;
      break;
    case BinaryConsts::I32x4Sub:
      curr = allocator.alloc<Binary>();
      curr->op = SubVecI32x4;
      break;
    case BinaryConsts::I32x4Mul:
      curr = allocator.alloc<Binary>();
      curr->op = MulVecI32x4;
      break;
    case BinaryConsts::I32x4MinS:
      curr = allocator.alloc<Binary>();
      curr->op = MinSVecI32x4;
      break;
    case BinaryConsts::I32x4MinU:
      curr = allocator.alloc<Binary>();
      curr->op = MinUVecI32x4;
      break;
    case BinaryConsts::I32x4MaxS:
      curr = allocator.alloc<Binary>();
      curr->op = MaxSVecI32x4;
      break;
    case BinaryConsts::I32x4MaxU:
      curr = allocator.alloc<Binary>();
      curr->op = MaxUVecI32x4;
      break;
    case BinaryConsts::I32x4DotI16x8S:
      curr = allocator.alloc<Binary>();
      curr->op = DotSVecI16x8ToVecI32x4;
      break;
    case BinaryConsts::I32x4ExtmulLowI16x8S:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulLowSVecI32x4;
      break;
    case BinaryConsts::I32x4ExtmulHighI16x8S:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulHighSVecI32x4;
      break;
    case BinaryConsts::I32x4ExtmulLowI16x8U:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulLowUVecI32x4;
      break;
    case BinaryConsts::I32x4ExtmulHighI16x8U:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulHighUVecI32x4;
      break;
    case BinaryConsts::I64x2Add:
      curr = allocator.alloc<Binary>();
      curr->op = AddVecI64x2;
      break;
    case BinaryConsts::I64x2Sub:
      curr = allocator.alloc<Binary>();
      curr->op = SubVecI64x2;
      break;
    case BinaryConsts::I64x2Mul:
      curr = allocator.alloc<Binary>();
      curr->op = MulVecI64x2;
      break;
    case BinaryConsts::I64x2ExtmulLowI32x4S:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulLowSVecI64x2;
      break;
    case BinaryConsts::I64x2ExtmulHighI32x4S:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulHighSVecI64x2;
      break;
    case BinaryConsts::I64x2ExtmulLowI32x4U:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulLowUVecI64x2;
      break;
    case BinaryConsts::I64x2ExtmulHighI32x4U:
      curr = allocator.alloc<Binary>();
      curr->op = ExtMulHighUVecI64x2;
      break;
    case BinaryConsts::F32x4Add:
      curr = allocator.alloc<Binary>();
      curr->op = AddVecF32x4;
      break;
    case BinaryConsts::F32x4Sub:
      curr = allocator.alloc<Binary>();
      curr->op = SubVecF32x4;
      break;
    case BinaryConsts::F32x4Mul:
      curr = allocator.alloc<Binary>();
      curr->op = MulVecF32x4;
      break;
    case BinaryConsts::F32x4Div:
      curr = allocator.alloc<Binary>();
      curr->op = DivVecF32x4;
      break;
    case BinaryConsts::F32x4Min:
      curr = allocator.alloc<Binary>();
      curr->op = MinVecF32x4;
      break;
    case BinaryConsts::F32x4Max:
      curr = allocator.alloc<Binary>();
      curr->op = MaxVecF32x4;
      break;
    case BinaryConsts::F32x4Pmin:
      curr = allocator.alloc<Binary>();
      curr->op = PMinVecF32x4;
      break;
    case BinaryConsts::F32x4Pmax:
      curr = allocator.alloc<Binary>();
      curr->op = PMaxVecF32x4;
      break;
    case BinaryConsts::F64x2Add:
      curr = allocator.alloc<Binary>();
      curr->op = AddVecF64x2;
      break;
    case BinaryConsts::F64x2Sub:
      curr = allocator.alloc<Binary>();
      curr->op = SubVecF64x2;
      break;
    case BinaryConsts::F64x2Mul:
      curr = allocator.alloc<Binary>();
      curr->op = MulVecF64x2;
      break;
    case BinaryConsts::F64x2Div:
      curr = allocator.alloc<Binary>();
      curr->op = DivVecF64x2;
      break;
    case BinaryConsts::F64x2Min:
      curr = allocator.alloc<Binary>();
      curr->op = MinVecF64x2;
      break;
    case BinaryConsts::F64x2Max:
      curr = allocator.alloc<Binary>();
      curr->op = MaxVecF64x2;
      break;
    case BinaryConsts::F64x2Pmin:
      curr = allocator.alloc<Binary>();
      curr->op = PMinVecF64x2;
      break;
    case BinaryConsts::F64x2Pmax:
      curr = allocator.alloc<Binary>();
      curr->op = PMaxVecF64x2;
      break;
    case BinaryConsts::I8x16NarrowI16x8S:
      curr = allocator.alloc<Binary>();
      curr->op = NarrowSVecI16x8ToVecI8x16;
      break;
    case BinaryConsts::I8x16NarrowI16x8U:
      curr = allocator.alloc<Binary>();
      curr->op = NarrowUVecI16x8ToVecI8x16;
      break;
    case BinaryConsts::I16x8NarrowI32x4S:
      curr = allocator.alloc<Binary>();
      curr->op = NarrowSVecI32x4ToVecI16x8;
      break;
    case BinaryConsts::I16x8NarrowI32x4U:
      curr = allocator.alloc<Binary>();
      curr->op = NarrowUVecI32x4ToVecI16x8;
      break;
    case BinaryConsts::I8x16Swizzle:
      curr = allocator.alloc<Binary>();
      curr->op = SwizzleVecI8x16;
      break;
    case BinaryConsts::I8x16RelaxedSwizzle:
      curr = allocator.alloc<Binary>();
      curr->op = RelaxedSwizzleVecI8x16;
      break;
    case BinaryConsts::F32x4RelaxedMin:
      curr = allocator.alloc<Binary>();
      curr->op = RelaxedMinVecF32x4;
      break;
    case BinaryConsts::F32x4RelaxedMax:
      curr = allocator.alloc<Binary>();
      curr->op = RelaxedMaxVecF32x4;
      break;
    case BinaryConsts::F64x2RelaxedMin:
      curr = allocator.alloc<Binary>();
      curr->op = RelaxedMinVecF64x2;
      break;
    case BinaryConsts::F64x2RelaxedMax:
      curr = allocator.alloc<Binary>();
      curr->op = RelaxedMaxVecF64x2;
      break;
    case BinaryConsts::I16x8RelaxedQ15MulrS:
      curr = allocator.alloc<Binary>();
      curr->op = RelaxedQ15MulrSVecI16x8;
      break;
    case BinaryConsts::I16x8DotI8x16I7x16S:
      curr = allocator.alloc<Binary>();
      curr->op = DotI8x16I7x16SToVecI16x8;
      break;
    default:
      return false;
  }
  BYN_TRACE("zz node: Binary\n");
  curr->right = popNonVoidExpression();
  curr->left = popNonVoidExpression();
  curr->finalize();
  out = curr;
  return true;
}